

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

Scal __thiscall LinearExpert<1,_1>::queryX(LinearExpert<1,_1> *this,X *x)

{
  double dVar1;
  Scal SVar2;
  double dVar3;
  double dVar4;
  X dx;
  double local_48;
  double **local_40;
  double *local_38;
  undefined1 *local_30;
  undefined1 local_28 [24];
  
  if (this->recompute == true) {
    dVar3 = (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
            m_data.array[0];
    dVar1 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
            m_data.array[0];
    dVar4 = dVar1 * dVar3;
    (this->PsiLambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
    array[0] = dVar4;
    dVar3 = dVar3 * dVar4;
    (this->LambdaPsiLambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
    m_data.array[0] = dVar3;
    dVar3 = dVar3 + (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                    m_storage.m_data.array[0];
    (this->pred_z_invVar).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
    m_data.array[0] = dVar3;
    dVar3 = 1.0 / dVar3;
    (this->pred_z_var).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
    .array[0] = dVar3;
    dVar1 = dVar1 - dVar3 * dVar4 * dVar4;
    (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
    .array[0] = dVar1;
    if (dVar1 < 0.0) {
      SVar2 = sqrt(dVar1);
    }
    else {
      SVar2 = SQRT(dVar1);
    }
    this->p_x_invVarSqrtDet = SVar2;
    this->recompute = false;
  }
  local_48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.
             array[0] -
             (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
             m_data.array[0];
  local_38 = &local_48;
  local_40 = &local_38;
  (this->pred_z).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (this->pred_z_var).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
        m_data.array[0] *
        (this->PsiLambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
        m_data.array[0] * local_48 +
        (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
        array[0];
  dVar3 = this->p_x_invVarSqrtDet;
  local_30 = local_28;
  dVar1 = exp((this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
              m_storage.m_data.array[0] * local_48 * local_48 * -0.5);
  dVar1 = dVar1 * dVar3;
  this->p_x_Norm = dVar1;
  return dVar1;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryX( X const &x )
{
    if( recompute )
    {
        PsiLambda = invPsi.asDiagonal() * Lambda;
        LambdaPsiLambda = Lambda.transpose() * PsiLambda;

        // Observation Variance
        pred_z_invVar = invSigma + LambdaPsiLambda;
        pred_z_var = pred_z_invVar.inverse();                      //TODO: Optimize this!

        p_x_invVar = - PsiLambda * pred_z_var * PsiLambda.transpose();
        p_x_invVar += invPsi.asDiagonal();
        p_x_invVarSqrtDet = sqrt(p_x_invVar.determinant());        //TODO: Optimize this!

        // Prediction Variance
//        pred_z_var_factor = pred_z_var * LambdaPsiLambda * pred_z_var;
//        if( wNu == 0.0 )
//            pred_z_var *= 1.0/Sh;
//        else
//        {
//            Z dz = Nu - Sz/Sh;
//            pred_z_var *= 1.0/Sh + dz.dot( varLambda * dz );
//        }

        recompute = false;
    }

    X dx = x - Mu;

    pred_z = Nu + pred_z_var * PsiLambda.transpose() * dx;
    p_x_Norm = p_x_invVarSqrtDet * exp( -0.5 * dx.dot(p_x_invVar * dx) );

    return p_x_Norm;
}